

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O3

void __thiscall CompileCommandParser::Next(CompileCommandParser *this)

{
  char cVar1;
  string local_38;
  
  cVar1 = std::istream::get();
  this->C = cVar1;
  if (((byte)this->Input[*(long *)(*(long *)this->Input + -0x18) + 0x20] & 1) != 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"Unexpected end of file.","");
    ErrorExit(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Next()
  {
    this->C = char(Input->get());
    if (this->Input->bad()) ErrorExit("Unexpected end of file.");
  }